

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O1

LIST_ITEM_HANDLE singlylinkedlist_get_next_item(LIST_ITEM_HANDLE item_handle)

{
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE pLVar2;
  
  if (item_handle == (LIST_ITEM_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      pLVar2 = (LIST_ITEM_HANDLE)0x0;
    }
    else {
      pLVar2 = (LIST_ITEM_HANDLE)0x0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_get_next_item",0xc2,1,"Invalid argument (list is NULL)");
    }
  }
  else {
    pLVar2 = (LIST_ITEM_HANDLE)item_handle->next;
  }
  return pLVar2;
}

Assistant:

LIST_ITEM_HANDLE singlylinkedlist_get_next_item(LIST_ITEM_HANDLE item_handle)
{
    LIST_ITEM_HANDLE result;

    if (item_handle == NULL)
    {
        LogError("Invalid argument (list is NULL)");
        /* Codes_SRS_LIST_01_019: [If item_handle is NULL then singlylinkedlist_get_next_item shall return NULL.] */
        result = NULL;
    }
    else
    {
        /* Codes_SRS_LIST_01_018: [singlylinkedlist_get_next_item shall return the next item in the list following the item item_handle.] */
        result = (LIST_ITEM_HANDLE)((LIST_ITEM_INSTANCE*)item_handle)->next;
    }

    return result;
}